

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

void makecorridors(level *lev,int style)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  schar *psVar10;
  uint uVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  bool bVar21;
  long local_40;
  
  switch(style) {
  case 1:
    if (1 < lev->nroom) {
      uVar16 = 0;
      iVar17 = 0;
      do {
        iVar19 = 100;
        if (100 < iVar17) {
          iVar19 = iVar17;
        }
        do {
          iVar14 = lev->nroom;
          uVar6 = mt_random();
          uVar12 = SUB168(ZEXT416(uVar6) % SEXT816((long)iVar14 + -1),0);
          if ((uVar16 != uVar12) && (iVar14 = iVar17, lev->rooms[uVar12].doorct == '\0')) break;
          iVar17 = iVar17 + 1;
          iVar14 = iVar19 + 1;
        } while (iVar19 + 1 != iVar17);
        iVar17 = iVar14;
        if (99 < iVar17) {
          uVar12 = 0;
          if (1 < lev->nroom) {
            uVar6 = lev->nroom - 1;
            uVar12 = 0;
            psVar10 = &lev->rooms[0].doorct;
            do {
              if ((uVar16 != uVar12) && (*psVar10 == '\0')) goto LAB_001d75f7;
              uVar12 = uVar12 + 1;
              psVar10 = psVar10 + 0xd8;
            } while (uVar6 != uVar12);
            uVar12 = (ulong)uVar6;
          }
        }
LAB_001d75f7:
        join(lev,(int)uVar16,(uint)(uVar16 == (uVar12 & 0xffffffff)) + (int)uVar12,'\0');
        uVar16 = uVar16 + 1;
      } while ((long)uVar16 < (long)lev->nroom);
    }
    break;
  case 2:
    iVar17 = lev->nroom;
    if (0 < iVar17) {
      iVar19 = 0;
      do {
        iVar14 = iVar19 + 1;
        join(lev,iVar19,iVar14 % iVar17,'\0');
        iVar17 = lev->nroom;
        iVar19 = iVar14;
      } while (iVar14 < iVar17);
    }
    break;
  case 3:
    uVar6 = lev->nroom;
    if (1 < (int)uVar6) {
      psVar10 = &lev->rooms[0].hy;
      iVar17 = 9999;
      uVar16 = 0;
      uVar12 = 0;
      do {
        uVar7 = (int)psVar10[-2] - (int)((mkroom *)(psVar10 + -3))->lx;
        iVar14 = (int)((mkroom *)(psVar10 + -3))->lx +
                 ((int)(short)((short)((uVar7 & 0xffff) >> 0xf) + (short)uVar7) >> 1) + -0x28;
        iVar19 = -iVar14;
        if (0 < iVar14) {
          iVar19 = iVar14;
        }
        uVar7 = (int)*psVar10 - (int)psVar10[-1];
        iVar9 = (int)psVar10[-1] +
                ((int)(short)((short)((uVar7 & 0xffff) >> 0xf) + (short)uVar7) >> 1) + -10;
        iVar14 = -iVar9;
        if (0 < iVar9) {
          iVar14 = iVar9;
        }
        if (iVar14 + iVar19 < iVar17) {
          uVar12 = uVar16 & 0xffffffff;
          iVar17 = iVar14 + iVar19;
        }
        uVar16 = uVar16 + 1;
        psVar10 = psVar10 + 0xd8;
      } while (uVar6 != uVar16);
      iVar17 = (int)uVar12;
      if (0 < iVar17) {
        iVar19 = 0;
        do {
          join(lev,iVar19,iVar17,'\0');
          iVar19 = iVar19 + 1;
        } while (iVar17 != iVar19);
        uVar6 = lev->nroom;
      }
      iVar19 = iVar17 + 1;
      if (iVar19 < (int)uVar6) {
        do {
          join(lev,iVar19,iVar17,'\0');
          iVar19 = iVar19 + 1;
        } while (iVar19 < lev->nroom);
      }
    }
    break;
  case 4:
    bVar21 = lev->rooms[0].lx == lev->rooms[2].lx;
    uVar6 = (uint)bVar21;
    uVar7 = uVar6 + 2;
    iVar17 = lev->nroom;
    if ((int)uVar7 < iVar17) {
      iVar19 = 0;
      do {
        uVar4 = mt_random();
        uVar16 = (ulong)uVar4 % (ulong)uVar7;
        iVar17 = (int)uVar16 + iVar19;
        join(lev,iVar17,iVar17 + uVar7,'\0');
        iVar17 = uVar6 + 1;
        do {
          uVar4 = mt_random();
          if ((uVar4 & 3) == 0) {
            uVar16 = (ulong)((int)uVar16 + 1) % (ulong)uVar7;
            iVar14 = (int)uVar16 + iVar19;
            join(lev,iVar14,iVar14 + uVar7,'\0');
          }
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
        iVar19 = iVar19 + uVar7;
        iVar17 = lev->nroom;
      } while (iVar19 < (int)(iVar17 - uVar7));
    }
    local_40 = 0x31db94;
    uVar16 = 0;
    do {
      uVar4 = mt_random();
      auVar2 = ZEXT416(uVar4) % SEXT816((long)(iVar17 / (int)uVar7));
      uVar12 = auVar2._0_8_;
      iVar17 = uVar7 * auVar2._0_4_;
      iVar19 = (int)uVar16;
      join(lev,iVar17 + iVar19,iVar17 + iVar19 + 1,'\0');
      iVar17 = lev->nroom;
      if (1 < iVar17 / (int)uVar7) {
        iVar14 = 1;
        do {
          uVar4 = mt_random();
          if ((uVar4 & 3) == 0) {
            iVar17 = lev->nroom;
            uVar4 = mt_random();
            iVar9 = lev->nroom / (int)uVar7;
            uVar12 = (long)((int)uVar12 +
                           SUB164(ZEXT416(uVar4) % SEXT816((long)(iVar17 / (int)uVar7 - iVar14)),0))
                     % (long)iVar9;
            uVar4 = (uint)uVar12;
            uVar15 = uVar12 & 0xffffffff;
            uVar8 = (ulong)(uVar4 * uVar7 + iVar19);
            if (smeq[uVar8] == smeq[uVar8 + 1]) {
              uVar5 = (lev->nroom * 2) / (int)uVar7;
              uVar11 = uVar4;
              if ((int)uVar4 <= (int)uVar5) {
                uVar11 = uVar5;
              }
              lVar20 = ((uVar12 & 0xffffffff) + 1) * (ulong)(uVar7 * 4);
              lVar18 = local_40;
              do {
                uVar4 = uVar11;
                if ((int)uVar5 <= (int)uVar15) break;
                lVar1 = lVar18 + -4;
                uVar4 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar4;
                piVar13 = (int *)(lVar18 + lVar20);
                lVar18 = lVar18 + (ulong)(uVar7 * 4);
              } while (*(int *)(lVar1 + lVar20) == *piVar13);
            }
            uVar8 = (long)(int)uVar4 % (long)iVar9;
            uVar12 = uVar8 & 0xffffffff;
            iVar17 = (int)uVar8 * uVar7;
            join(lev,iVar17 + iVar19,iVar17 + iVar19 + 1,'\0');
          }
          iVar14 = iVar14 + 1;
          iVar17 = lev->nroom;
        } while (iVar14 < iVar17 / (int)uVar7);
      }
      uVar16 = uVar16 + 1;
      local_40 = local_40 + 4;
    } while (uVar16 != uVar6 + 1);
    if (0 < iVar17) {
      uVar16 = 0;
      do {
        iVar17 = smeq[uVar16];
        iVar19 = smeq[iVar17];
        if (iVar19 < iVar17) {
          piVar13 = smeq + uVar16;
          do {
            *piVar13 = iVar19;
            piVar13 = smeq + iVar19;
            iVar17 = *piVar13;
            iVar19 = smeq[iVar17];
          } while (iVar19 < iVar17);
        }
        if (iVar17 != 0) {
          join(lev,(int)uVar16,
               (-(uint)((int)((uVar16 & 0xffffffff) % (ulong)uVar7) != 0) | -(uint)bVar21 - 2) +
               (int)uVar16,'\0');
        }
        uVar16 = uVar16 + 1;
      } while ((long)uVar16 < (long)lev->nroom);
    }
    break;
  default:
    iVar17 = 1;
    do {
      uVar6 = lev->nroom;
      if ((int)(uVar6 - 1) <= iVar17 + -1) goto LAB_001d7a1e;
      join(lev,iVar17 + -1,iVar17,'\0');
      uVar6 = mt_random();
      iVar17 = iVar17 + 1;
    } while (0x51eb851 < (uVar6 * -0x3d70a3d7 >> 1 | (uint)((uVar6 * -0x3d70a3d7 & 1) != 0) << 0x1f)
            );
    uVar6 = lev->nroom;
LAB_001d7a1e:
    if (2 < (int)uVar6) {
      lVar18 = 0;
      do {
        if (smeq[lVar18] != smeq[lVar18 + 2]) {
          join(lev,(int)lVar18,(int)lVar18 + 2,'\0');
          uVar6 = lev->nroom;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < (int)(uVar6 - 2));
    }
    lVar18 = 0;
    do {
      if ((int)uVar6 <= lVar18) break;
      lVar20 = 0;
      bVar21 = false;
      do {
        if (smeq[lVar18] != smeq[lVar20]) {
          join(lev,(int)lVar18,(int)lVar20,'\0');
          uVar6 = lev->nroom;
          bVar21 = true;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < (int)uVar6);
      lVar18 = lVar18 + 1;
    } while (bVar21);
    if (2 < (int)uVar6) {
      uVar7 = mt_random();
      iVar17 = uVar7 % uVar6 + 4;
      do {
        iVar19 = lev->nroom;
        uVar6 = mt_random();
        auVar2 = ZEXT416(uVar6) % SEXT816((long)iVar19);
        iVar19 = lev->nroom;
        uVar6 = mt_random();
        auVar3 = ZEXT416(uVar6) % SEXT816((long)iVar19 + -2);
        iVar19 = auVar3._0_4_;
        iVar14 = iVar19 + 2;
        if (auVar3._0_8_ < auVar2._0_8_) {
          iVar14 = iVar19;
        }
        join(lev,auVar2._0_4_,iVar14,'\x01');
        iVar17 = iVar17 + -1;
      } while (iVar17 != 0);
    }
  }
  return;
}

Assistant:

void makecorridors(struct level *lev, int style)
{
	int a, b, i;
	boolean any = TRUE;

	switch (style) {
	case LEVSTYLE_STANDARD:
	default: /* vanilla style */
	    for (a = 0; a < lev->nroom - 1; a++) {
		join(lev, a, a + 1, FALSE);
		if (!rn2(50))
		    break; /* allow some randomness */
	    }
	    for (a = 0; a < lev->nroom - 2; a++) {
		if (smeq[a] != smeq[a + 2])
		    join(lev, a, a + 2, FALSE);
	    }
	    for (a = 0; any && a < lev->nroom; a++) {
		any = FALSE;
		for (b = 0; b < lev->nroom; b++) {
		    if (smeq[a] != smeq[b]) {
			join(lev, a, b, FALSE);
			any = TRUE;
		    }
		}
	    }
	    if (lev->nroom > 2) {
		for (i = rn2(lev->nroom) + 4; i; i--) {
		    a = rn2(lev->nroom);
		    b = rn2(lev->nroom - 2);
		    if (b >= a)
			b += 2;
		    join(lev, a, b, TRUE);
		}
	    }
	    break;

	case LEVSTYLE_ANYTOANY: /* at least one corridor leaves from each room
				 * and goes to a random room */
	    if (lev->nroom > 1) {
		int cnt = 0;
		for (a = 0; a < lev->nroom; a++) {
		    do {
			b = rn2(lev->nroom - 1);
		    } while ((a == b || lev->rooms[b].doorct) && cnt++ < 100);
		    if (cnt >= 100) {
			for (b = 0; b < lev->nroom - 1; b++) {
			    if (!lev->rooms[b].doorct && a != b)
				break;
			}
		    }
		    if (a == b)
			b++;
		    join(lev, a, b, FALSE);
		}
	    }
	    break;

	case LEVSTYLE_RING: /* circular path:
			     * room1 -> room2 -> room3 -> ... -> room1 */
	    for (a = 0; a < lev->nroom; a++) {
		b = (a + 1) % lev->nroom;
		join(lev, a, b, FALSE);
	    }
	    break;

	case LEVSTYLE_HUB: /* all roads lead to rome... or to the first room */
	    if (lev->nroom > 1) {
		/* find the most central room Manhattan-style */
		int mindist = 9999; /* arbitrary big number */
		b = 0;
		for (i = 0; i < lev->nroom; i++) {
		    struct mkroom *r = &lev->rooms[i];
		    int cx = abs(r->lx + (r->hx - r->lx) / 2 - COLNO / 2);
		    int cy = abs(r->ly + (r->hy - r->ly) / 2 - ROWNO / 2);
		    if (cx + cy < mindist) {
			b = i;
			mindist = cx + cy;
		    }
		}

		for (a = 0; a < b; a++)
		    join(lev, a, b, FALSE);
		for (a = b + 1; a < lev->nroom; a++)
		    join(lev, a, b, FALSE);
	    }
	    break;

	case LEVSTYLE_GRID: /* rooms should be in column-major order */
	    {
		/* First, we need to establish whether the grid height is 2 or 3. */
		int grid_height = (lev->rooms[0].lx == lev->rooms[2].lx) ? 3 : 2;
		int r;

		/* Make random horizontal joins, at least one per column. */
		for (a = 0; a < lev->nroom - grid_height; a += grid_height) {
		    r = rn2(grid_height);
		    join(lev, a + r, a + r + grid_height, FALSE);

		    for (b = 1; b < grid_height; b++) {
			if (!rn2(4)) {
			    r = (r + 1) % grid_height;
			    join(lev, a + r, a + r + grid_height, FALSE);
			}
		    }
		}

		/* Make vertical joins, at least one per row. */
		for (b = 0; b < grid_height - 1; b++) {
		    r = rn2(lev->nroom / grid_height);
		    join(lev, b+grid_height*r, b+grid_height*r+1, FALSE);

		    for (a = 1; a < lev->nroom / grid_height; a++) {
			if (!rn2(4)) {
			    /* Pick a random column. */
			    r = (r + rn2(lev->nroom / grid_height - a)) %
				(lev->nroom / grid_height);
			    /* Move along to one that isn't already joined. */
			    while (smeq[b+grid_height*r] == smeq[b+grid_height*r+1] &&
				   r < 2 * lev->nroom / grid_height) {
				r++;
			    }
			    r %= lev->nroom / grid_height;
			    /* Join it. */
			    join(lev, b+grid_height*r, b+grid_height*r+1, FALSE);
			}
		    }
		}

		/* Finally, just make sure that all rooms are connected. */
		for (a = 0; a < lev->nroom; a++) {
		    b = a;
		    while (smeq[b] > smeq[smeq[b]]) {
			smeq[b] = smeq[smeq[b]]; /* Just to speed up later checks. */
			b = smeq[b];
		    }
		    if (smeq[b] != 0) {
			/*
			 * Well, we know that the rooms before this one are connected
			 * to room 0...
			 */
			if (a % grid_height == 0) {
			    join(lev, a, a - grid_height, FALSE);
			} else {
			    join(lev, a, a - 1, FALSE);
			}
		    }
		}
	    }
	    break;
	}
}